

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdswitch.c
# Opt level: O0

boolean set_sample_factors(j_compress_ptr cinfo,char *arg)

{
  int iVar1;
  char *in_RSI;
  long in_RDI;
  bool bVar2;
  char ch2;
  char ch1;
  int val2;
  int val1;
  int ci;
  char local_26;
  char local_25;
  int local_24;
  int local_20;
  int local_1c;
  char *local_18;
  long local_10;
  
  local_1c = 0;
  local_18 = in_RSI;
  local_10 = in_RDI;
  do {
    if (9 < local_1c) {
      return 1;
    }
    if (*local_18 == '\0') {
      *(undefined4 *)(*(long *)(local_10 + 0x58) + (long)local_1c * 0x60 + 8) = 1;
      *(undefined4 *)(*(long *)(local_10 + 0x58) + (long)local_1c * 0x60 + 0xc) = 1;
    }
    else {
      local_26 = ',';
      iVar1 = __isoc99_sscanf(local_18,"%d%c%d%c",&local_20,&local_25,&local_24,&local_26);
      if (iVar1 < 3) {
        return 0;
      }
      if (((local_25 != 'x') && (local_25 != 'X')) || (local_26 != ',')) {
        return 0;
      }
      if (((local_20 < 1) || (4 < local_20)) || ((local_24 < 1 || (4 < local_24)))) {
        fprintf(_stderr,"JPEG sampling factors must be 1..4\n");
        return 0;
      }
      *(int *)(*(long *)(local_10 + 0x58) + (long)local_1c * 0x60 + 8) = local_20;
      *(int *)(*(long *)(local_10 + 0x58) + (long)local_1c * 0x60 + 0xc) = local_24;
      do {
        bVar2 = false;
        if (*local_18 != '\0') {
          bVar2 = *local_18 != ',';
          local_18 = local_18 + 1;
        }
      } while (bVar2);
    }
    local_1c = local_1c + 1;
  } while( true );
}

Assistant:

GLOBAL(boolean)
set_sample_factors(j_compress_ptr cinfo, char *arg)
/* Process a sample-factors parameter string, of the form
 *     HxV[,HxV,...]
 * If there are more components than parameters, "1x1" is assumed for the rest.
 */
{
  int ci, val1, val2;
  char ch1, ch2;

  for (ci = 0; ci < MAX_COMPONENTS; ci++) {
    if (*arg) {
      ch2 = ',';                /* if not set by sscanf, will be ',' */
      if (sscanf(arg, "%d%c%d%c", &val1, &ch1, &val2, &ch2) < 3)
        return FALSE;
      if ((ch1 != 'x' && ch1 != 'X') || ch2 != ',') /* syntax check */
        return FALSE;
      if (val1 <= 0 || val1 > 4 || val2 <= 0 || val2 > 4) {
        fprintf(stderr, "JPEG sampling factors must be 1..4\n");
        return FALSE;
      }
      cinfo->comp_info[ci].h_samp_factor = val1;
      cinfo->comp_info[ci].v_samp_factor = val2;
      while (*arg && *arg++ != ',');  /* advance to next segment of arg
                                         string */
    } else {
      /* reached end of parameter, set remaining components to 1x1 sampling */
      cinfo->comp_info[ci].h_samp_factor = 1;
      cinfo->comp_info[ci].v_samp_factor = 1;
    }
  }
  return TRUE;
}